

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

LogicProgram * __thiscall
Clasp::Asp::LogicProgram::addMinimize(LogicProgram *this,weight_t prio,WeightLitSpan *lits)

{
  Atom_t AVar1;
  pointer ppMVar2;
  Min *pMVar3;
  WeightLit_t *pWVar4;
  size_t sVar5;
  Atom_t atomId;
  undefined8 *puVar6;
  Min **pos;
  long lVar7;
  Min *pMVar8;
  SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject> n;
  Min *local_30;
  
  if ((this->super_ProgramBuilder).frozen_ != true) {
    puVar6 = (undefined8 *)operator_new(0x18);
    n.ptr_ = (ulong)puVar6 | 1;
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6[2] = 0;
    pMVar8 = (Min *)((ulong)puVar6 & 0xfffffffffffffffe);
    pMVar8->prio = prio;
    ppMVar2 = (this->minimize_).ebo_.buf;
    local_30 = pMVar8;
    pos = std::
          __lower_bound<Clasp::Asp::LogicProgram::Min**,Clasp::Asp::LogicProgram::Min*,__gnu_cxx::__ops::_Iter_comp_val<Clasp::Asp::LogicProgram::CmpMin>>
                    (ppMVar2,ppMVar2 + (this->minimize_).ebo_.size);
    if ((pos == (this->minimize_).ebo_.buf + (this->minimize_).ebo_.size) ||
       (pMVar3 = *pos, pMVar3->prio != prio)) {
      bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
      assign<Potassco::WeightLit_t_const*>
                ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)
                 &pMVar8->lits,lits->first,lits->first + lits->size);
      local_30 = (Min *)(n.ptr_ & 0xfffffffffffffffe);
      bk_lib::
      pod_vector<Clasp::Asp::LogicProgram::Min_*,_std::allocator<Clasp::Asp::LogicProgram::Min_*>_>
      ::insert(&this->minimize_,pos,&local_30);
      n.ptr_ = n.ptr_ & 0xfffffffffffffffe;
      *(int *)(&this->field_0x24 + (long)this->statsId_ * 0x14) =
           *(int *)(&this->field_0x24 + (long)this->statsId_ * 0x14) + 1;
    }
    else {
      bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
      insert_range<Potassco::WeightLit_t_const*>
                ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)
                 &pMVar3->lits,(pMVar3->lits).ebo_.buf + (pMVar3->lits).ebo_.size,lits->first,
                 lits->first + lits->size,0);
    }
    pWVar4 = lits->first;
    sVar5 = lits->size;
    for (lVar7 = 0; sVar5 << 3 != lVar7; lVar7 = lVar7 + 8) {
      AVar1 = *(Atom_t *)((long)&pWVar4->lit + lVar7);
      atomId = -AVar1;
      if (0 < (int)AVar1) {
        atomId = AVar1;
      }
      resize(this,atomId);
    }
    SingleOwnerPtr<Clasp::Asp::LogicProgram::Min,_Clasp::DeleteObject>::~SingleOwnerPtr(&n);
    return this;
  }
  Potassco::fail(-2,
                 "LogicProgram &Clasp::Asp::LogicProgram::addMinimize(weight_t, const Potassco::WeightLitSpan &)"
                 ,0x349,"!frozen()","Can\'t update frozen program!",0);
}

Assistant:

LogicProgram& LogicProgram::addMinimize(weight_t prio, const Potassco::WeightLitSpan& lits) {
	check_not_frozen();
	SingleOwnerPtr<Min> n(new Min());
	n->prio = prio;
	MinList::iterator it = std::lower_bound(minimize_.begin(), minimize_.end(), n.get(), CmpMin());
	if (it == minimize_.end() || (*it)->prio != prio) {
		n->lits.assign(Potassco::begin(lits), Potassco::end(lits));
		minimize_.insert(it, n.get());
		n.release();
		upStat(RuleStats::Minimize);
	}
	else {
		(*it)->lits.insert((*it)->lits.end(), Potassco::begin(lits), Potassco::end(lits));
	}
	// Touch all atoms in minimize -> these are input atoms even if they won't occur in a head.
	for (Potassco::WeightLitSpan::iterator wIt = Potassco::begin(lits), end = Potassco::end(lits); wIt != end; ++wIt) {
		resize(Potassco::atom(*wIt));
	}
	return *this;
}